

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_replace(char *dest,int dest_sz,char *src,char *find,char *replace)

{
  char cVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int local_68;
  int var__b;
  int var__a;
  int l;
  char *start;
  int dest_max;
  int offset;
  int srclen;
  int rlen;
  int flen;
  char f;
  char *replace_local;
  char *find_local;
  char *src_local;
  int dest_sz_local;
  char *dest_local;
  
  if (dest == src) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x23c,"dest != src");
    pcVar2 = (code *)swi(3);
    pcVar6 = (char *)(*pcVar2)();
    return pcVar6;
  }
  cVar1 = *find;
  iVar3 = sx_strlen(find);
  iVar4 = sx_strlen(replace);
  dest_max = sx_strlen(src);
  start._4_4_ = 0;
  for (find_local = src; *find_local != '\0' && start._4_4_ < dest_sz + -1;
      find_local = find_local + 1) {
    if (cVar1 == *find_local) {
      dest_max = dest_max - ((int)find_local - (int)src);
      if ((dest_max < iVar3) || (iVar5 = memcmp(find_local,find,(long)iVar3), iVar5 != 0)) {
        dest[start._4_4_] = *find_local;
        start._4_4_ = start._4_4_ + 1;
      }
      else {
        find_local = find_local + iVar3;
        iVar5 = (dest_sz + -1) - start._4_4_;
        local_68 = iVar4;
        if (iVar5 < iVar4) {
          local_68 = iVar5;
        }
        memcpy(dest + start._4_4_,replace,(long)local_68);
        start._4_4_ = local_68 + start._4_4_;
      }
    }
    else {
      dest[start._4_4_] = *find_local;
      start._4_4_ = start._4_4_ + 1;
    }
  }
  dest[start._4_4_] = '\0';
  return dest;
}

Assistant:

char* sx_replace(char* dest, int dest_sz, const char* src, const char* find, const char* replace)
{
    sx_assert(dest != src);

    char f = find[0];
    int flen = sx_strlen(find);
    int rlen = sx_strlen(replace);
    int srclen = sx_strlen(src);
    int offset = 0;
    int dest_max = dest_sz - 1;
    const char* start = src;

    while (*src && offset < dest_max) {
        // Found first character, check for rest
        if (f != *src) {
            dest[offset++] = *src;
        } else {
            srclen -= (int)(intptr_t)(src - start);

            if (srclen >= flen && sx_memcmp(src, find, flen) == 0) {
                src += flen;
                int l = sx_min(dest_max - offset, rlen);
                sx_memcpy(dest + offset, replace, l);
                offset += l;
            } else {
                dest[offset++] = *src;
            }
        }

        ++src;
    }

    dest[offset] = '\0';
    return dest;
}